

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O1

vector<Data_*,_std::allocator<Data_*>_> * __thiscall
Bracket::genParaData(Bracket *this,Runtime *runtime)

{
  vector<Data_*,_std::allocator<Data_*>_> *this_00;
  undefined8 uVar1;
  _List_node_base *p_Var2;
  long lVar3;
  list<Atom_*,_std::allocator<Atom_*>_> *plVar4;
  allocator_type local_29;
  
  this_00 = (vector<Data_*,_std::allocator<Data_*>_> *)operator_new(0x18);
  std::vector<Data_*,_std::allocator<Data_*>_>::vector
            (this_00,(this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                     _M_size,&local_29);
  plVar4 = &this->para;
  p_Var2 = (plVar4->super__List_base<Atom_*,_std::allocator<Atom_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)plVar4) {
    lVar3 = 0;
    do {
      uVar1 = (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x18))(p_Var2[1]._M_next,runtime);
      *(undefined8 *)
       ((long)(this_00->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar3) = uVar1;
      p_Var2 = p_Var2->_M_next;
      lVar3 = lVar3 + 8;
    } while (p_Var2 != (_List_node_base *)plVar4);
  }
  return this_00;
}

Assistant:

std::vector<Data *> *Bracket::genParaData(Runtime *runtime) {
    auto result = new std::vector<Data *>(para.size());
    auto cursor = para.begin();
    auto i = 0;
    while (cursor != para.end()) {
        (*result)[i] = (*cursor)->eval(runtime);
        cursor++;
        i++;
    }
    return result;
}